

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O2

void __thiscall Assimp::STLExporter::WriteMeshBinary(STLExporter *this,aiMesh *m)

{
  uint uVar1;
  aiVector3D *paVar2;
  uint a;
  ulong uVar3;
  uint a_1;
  aiFace *paVar4;
  aiVector3t<float> local_60;
  char dummy [2];
  float vz;
  float vy;
  float nz;
  float ny;
  float nx;
  ulong local_38;
  
  for (local_38 = 0; local_38 < m->mNumFaces; local_38 = local_38 + 1) {
    paVar4 = m->mFaces + local_38;
    local_60.x = 0.0;
    local_60.y = 0.0;
    local_60.z = 0.0;
    paVar2 = m->mNormals;
    if (paVar2 != (aiVector3D *)0x0) {
      for (uVar3 = 0; uVar3 < paVar4->mNumIndices; uVar3 = uVar3 + 1) {
        uVar1 = paVar4->mIndices[uVar3];
        local_60.x = local_60.x + paVar2[uVar1].x;
        local_60.y = local_60.y + paVar2[uVar1].y;
        local_60.z = local_60.z + paVar2[uVar1].z;
      }
      aiVector3t<float>::Normalize(&local_60);
    }
    nz = local_60.z;
    ny = local_60.y;
    nx = local_60.x;
    std::ostream::write((char *)this,(long)&nx);
    std::ostream::write((char *)this,(long)&ny);
    std::ostream::write((char *)this,(long)&nz);
    for (uVar3 = 0; uVar3 < paVar4->mNumIndices; uVar3 = uVar3 + 1) {
      paVar2 = m->mVertices;
      uVar1 = paVar4->mIndices[uVar3];
      _dummy = paVar2[uVar1].x;
      vy = paVar2[uVar1].y;
      vz = paVar2[uVar1].z;
      std::ostream::write((char *)this,(long)dummy);
      std::ostream::write((char *)this,(long)&vy);
      std::ostream::write((char *)this,(long)&vz);
    }
    _dummy = (float)((uint)_dummy & 0xffff0000);
    std::ostream::write((char *)this,(long)dummy);
  }
  return;
}

Assistant:

void STLExporter::WriteMeshBinary(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.Normalize();
        }
        // STL binary files use 4-byte floats. This may possibly cause loss of precision
        // for clients using 8-byte doubles
        float nx = (float) nor.x;
        float ny = (float) nor.y;
        float nz = (float) nor.z;
        AI_SWAP4(nx); AI_SWAP4(ny); AI_SWAP4(nz);
        mOutput.write((char *)&nx, 4); mOutput.write((char *)&ny, 4); mOutput.write((char *)&nz, 4);
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            float vx = (float) v.x, vy = (float) v.y, vz = (float) v.z;
            AI_SWAP4(vx); AI_SWAP4(vy); AI_SWAP4(vz);
            mOutput.write((char *)&vx, 4); mOutput.write((char *)&vy, 4); mOutput.write((char *)&vz, 4);
        }
        char dummy[2] = {0};
        mOutput.write(dummy, 2);
    }
}